

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  size_t *local_118;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [32];
  string local_98 [32];
  ulong local_78;
  size_t max_dimension_index;
  string shader_source;
  allocator<char> local_39;
  string local_38 [8];
  string example_struct;
  TestShaderType tested_shader_type_local;
  SizedDeclarationsStructTypes3<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  example_struct.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"struct light {\n    float[2] intensity;\n    int[2] position;\n};\n",
             &local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)&max_dimension_index);
  for (local_78 = 1; local_78 < 9; local_78 = local_78 + 1) {
    std::__cxx11::string::operator=((string *)&max_dimension_index,local_38);
    std::__cxx11::string::operator+=
              ((string *)&max_dimension_index,(string *)shader_start_abi_cxx11_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_b8,"    light my_light_object",&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_e0,"[2]",(allocator<char> *)((long)&cs + 7));
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(local_98,this,local_b8,local_e0,local_78);
    std::__cxx11::string::operator+=((string *)&max_dimension_index,local_98);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cs + 7));
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::__cxx11::string::operator+=((string *)&max_dimension_index,";\n");
    switch(example_struct.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=
                ((string *)&max_dimension_index,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=
                ((string *)&max_dimension_index,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=
                ((string *)&max_dimension_index,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x594);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)&max_dimension_index,(string *)shader_end_abi_cxx11_)
    ;
    vs = (string *)empty_string_abi_cxx11_;
    tcs = (string *)default_vertex_shader_source_abi_cxx11_;
    tes = (string *)default_tc_shader_source_abi_cxx11_;
    gs = (string *)default_te_shader_source_abi_cxx11_;
    fs = (string *)default_geometry_shader_source_abi_cxx11_;
    local_118 = (size_t *)default_fragment_shader_source_abi_cxx11_;
    switch(example_struct.field_2._12_4_) {
    case 0:
      local_118 = &max_dimension_index;
      break;
    case 1:
      tcs = (string *)&max_dimension_index;
      break;
    case 2:
      vs = (string *)&max_dimension_index;
      tcs = (string *)empty_string_abi_cxx11_;
      tes = (string *)empty_string_abi_cxx11_;
      gs = (string *)empty_string_abi_cxx11_;
      fs = (string *)empty_string_abi_cxx11_;
      local_118 = (size_t *)empty_string_abi_cxx11_;
      break;
    case 3:
      fs = (string *)&max_dimension_index;
      break;
    case 4:
      tes = (string *)&max_dimension_index;
      break;
    case 5:
      gs = (string *)&max_dimension_index;
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x597);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,tcs,tes,gs,fs,local_118,vs,1,0);
  }
  std::__cxx11::string::~string((string *)&max_dimension_index);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SizedDeclarationsStructTypes3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_struct("struct light {\n"
							   "    float[2] intensity;\n"
							   "    int[2] position;\n"
							   "};\n");
	std::string shader_source;

	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		shader_source = example_struct;
		shader_source += shader_start;
		shader_source += this->extend_string("    light my_light_object", "[2]", max_dimension_index);
		shader_source += ";\n";

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}